

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::ban_ip(session_impl *this,address *addr)

{
  bool bVar1;
  element_type *this_00;
  element_type *this_01;
  shared_ptr<const_libtorrent::ip_filter> local_58;
  __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_48;
  shared_ptr<libtorrent::aux::torrent> *i;
  iterator __end2;
  iterator __begin2;
  torrent_list<libtorrent::aux::torrent> *__range2;
  address *local_18;
  address *addr_local;
  session_impl *this_local;
  
  local_18 = addr;
  addr_local = (address *)this;
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_ip_filter);
  if (!bVar1) {
    ::std::make_shared<libtorrent::ip_filter>();
    ::std::shared_ptr<libtorrent::ip_filter>::operator=
              (&this->m_ip_filter,(shared_ptr<libtorrent::ip_filter> *)&__range2);
    ::std::shared_ptr<libtorrent::ip_filter>::~shared_ptr
              ((shared_ptr<libtorrent::ip_filter> *)&__range2);
  }
  this_00 = ::std::
            __shared_ptr_access<libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->m_ip_filter);
  ip_filter::add_rule(this_00,addr,addr,1);
  __end2 = torrent_list<libtorrent::aux::torrent>::begin(&this->m_torrents);
  i = (shared_ptr<libtorrent::aux::torrent> *)
      torrent_list<libtorrent::aux::torrent>::end(&this->m_torrents);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
                                *)&i);
    if (!bVar1) break;
    local_48 = (__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)__gnu_cxx::
                  __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
                  ::operator*(&__end2);
    this_01 = ::std::
              __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(local_48);
    ::std::shared_ptr<libtorrent::ip_filter_const>::shared_ptr<libtorrent::ip_filter,void>
              ((shared_ptr<libtorrent::ip_filter_const> *)&local_58,&this->m_ip_filter);
    torrent::set_ip_filter(this_01,&local_58);
    ::std::shared_ptr<const_libtorrent::ip_filter>::~shared_ptr(&local_58);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void session_impl::ban_ip(address addr)
	{
		TORRENT_ASSERT(is_single_thread());
		if (!m_ip_filter) m_ip_filter = std::make_shared<ip_filter>();
		m_ip_filter->add_rule(addr, addr, ip_filter::blocked);
		for (auto& i : m_torrents)
			i->set_ip_filter(m_ip_filter);
	}